

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
trieste::PassDef::PassDef
          (PassDef *this,string *name,Wellformed *wf,flag direction,
          initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
          *r)

{
  _Rb_tree_header *p_Var1;
  allocator_type local_39 [9];
  
  std::__cxx11::string::string
            ((string *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
  this->wf_ = wf;
  this->direction_ = direction;
  std::
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  ::vector((vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
            *)&this->rules_,*r,local_39);
  detail::
  DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
  ::DefaultMap(&this->rule_map);
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->pre_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->pre_once).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->pre_once).super__Function_base._M_functor + 8) = 0;
  (this->pre_once).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->pre_once)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->post_once).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->post_once).super__Function_base._M_functor + 8) = 0;
  (this->post_once).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->post_once)._M_invoker = (_Invoker_type)0x0;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->post_)._M_t._M_impl.super__Rb_tree_header;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->post_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  compile_rules(this);
  return;
}

Assistant:

PassDef(
      const std::string& name,
      const wf::Wellformed& wf,
      dir::flag direction,
      const std::initializer_list<detail::PatternEffect<Node>>& r)
    : name_(name), wf_(wf), direction_(direction), rules_(r)
    {
      compile_rules();
    }